

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_test_cases.cpp
# Opt level: O3

void flat_forward_list_validate_array_test1<8ul>
               (char *title,bool expected_to_be_valid,FLAT_FORWARD_LIST_TEST (*a) [8])

{
  ulong uVar1;
  FLAT_FORWARD_LIST_TEST (*paFVar2) [8];
  ulong uVar3;
  FLAT_FORWARD_LIST_TEST (*paFVar4) [8];
  FLAT_FORWARD_LIST_TEST *pFVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  char *begin;
  undefined1 local_68 [24];
  FLAT_FORWARD_LIST_TEST (*paFStack_50) [8];
  FLAT_FORWARD_LIST_TEST (*local_48) [8];
  buffer_t<char> local_40;
  
  printf("-----\"%s\"-----\n",title);
  local_40.end = (pointer_type)(a + 1);
  paFVar2 = a;
  uVar3 = 0xc0;
  local_40.last = (pointer_type)(FLAT_FORWARD_LIST_TEST (*) [8])0x0;
  do {
    paFVar4 = paFVar2;
    uVar1 = (*paFVar4)[0].NextEntryOffset;
    uVar7 = uVar3 - uVar1;
    if (uVar3 < uVar1) {
LAB_00108150:
      bVar6 = false;
      goto LAB_0010815f;
    }
    uVar8 = (*paFVar4)[0].DataLength + 0x18;
    if (uVar1 == 0) {
      bVar6 = uVar8 <= uVar3;
      if (uVar8 <= uVar3) {
        local_40.last = (pointer_type)paFVar4;
      }
      goto LAB_0010815f;
    }
    if (uVar1 < uVar8) goto LAB_00108150;
    paFVar2 = (FLAT_FORWARD_LIST_TEST (*) [8])((long)&(*paFVar4)[0].NextEntryOffset + uVar1);
    uVar3 = uVar7;
    local_40.last = (pointer_type)paFVar4;
    if (uVar7 < 0x18) {
      bVar6 = false;
LAB_0010815f:
      local_40.begin = (pointer_type)a;
      iffl::buffer_t<char>::validate(&local_40);
      local_68._16_8_ = local_40.begin;
      paFStack_50 = (FLAT_FORWARD_LIST_TEST (*) [8])local_40.last;
      local_48 = (FLAT_FORWARD_LIST_TEST (*) [8])local_40.end;
      local_68[8] = bVar6;
      if (bVar6 != expected_to_be_valid) {
        std::terminate();
      }
      if (bVar6 != false) {
        iffl::
        flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
        ::begin((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                 *)local_68);
        iffl::buffer_t<char>::validate((buffer_t<char> *)(local_68 + 0x10));
        if (paFStack_50 == (FLAT_FORWARD_LIST_TEST (*) [8])0x0) {
          pFVar5 = (FLAT_FORWARD_LIST_TEST *)0x0;
        }
        else {
          uVar3 = (*paFStack_50)[0].NextEntryOffset;
          if (uVar3 == 0) {
            uVar3 = (*paFStack_50)[0].DataLength + 0x1f & 0xfffffffffffffff8;
          }
          pFVar5 = (FLAT_FORWARD_LIST_TEST *)((long)&(*paFStack_50)[0].NextEntryOffset + uVar3);
        }
        for (; (FLAT_FORWARD_LIST_TEST *)local_68._0_8_ != pFVar5;
            local_68._0_8_ = (long)(size_t *)local_68._0_8_ + uVar3) {
          print_element((FLAT_FORWARD_LIST_TEST *)local_68._0_8_);
          uVar3 = *(size_t *)local_68._0_8_;
          if (uVar3 == 0) {
            uVar3 = *(size_t *)(local_68._0_8_ + 0x10) + 0x1f & 0xfffffffffffffff8;
          }
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void flat_forward_list_validate_array_test1(char const * title, bool expected_to_be_valid, FLAT_FORWARD_LIST_TEST const (&a)[N]) {
    std::printf("-----\"%s\"-----\n", title);
    auto[is_valid, buffer_view] = iffl::flat_forward_list_validate(a, a + N);
    FFL_CODDING_ERROR_IF_NOT(is_valid == expected_to_be_valid);

    if (is_valid) {
        std::for_each(buffer_view.begin(), 
                      buffer_view.end(), 
                      [](FLAT_FORWARD_LIST_TEST const &e) noexcept {
            print_element(e);
        });
    }
}